

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileAction.cpp
# Opt level: O0

void __thiscall QFileActionPrivate::triggered(QFileActionPrivate *this)

{
  int iVar1;
  bool bVar2;
  QString *pQVar3;
  QFlags<QFileDialog::Option> *pQVar4;
  QListSpecialMethods<QString> *this_00;
  long in_RDI;
  QString fn;
  QString dir;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  Int in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  QString *in_stack_fffffffffffffd20;
  QListSpecialMethods<QString> *in_stack_fffffffffffffd28;
  QFlags<QFileDialog::Option> local_284;
  QWidget local_280 [28];
  Int local_264;
  QWidget local_260 [28];
  QFlags<QFileDialog::Option> local_244;
  QArrayDataPointer<char16_t> local_240 [2];
  QString local_210;
  QWidget local_1f8 [28];
  Int local_1dc;
  QArrayDataPointer<char16_t> local_1d8 [2];
  QString local_1a8;
  QWidget local_190 [28];
  QFlags<QFileDialog::Option> local_174;
  QArrayDataPointer<char16_t> local_170 [2];
  QString local_140;
  QWidget local_128 [28];
  Int local_10c;
  QArrayDataPointer<char16_t> local_108 [2];
  QString local_d8;
  QWidget local_c0 [64];
  QString local_80;
  char16_t *local_60;
  char16_t *local_58;
  QArrayDataPointer<char16_t> *local_50;
  char16_t *local_48;
  char16_t *local_40;
  QArrayDataPointer<char16_t> *local_38;
  char16_t *local_30;
  char16_t *local_28;
  QArrayDataPointer<char16_t> *local_20;
  char16_t *local_18;
  char16_t *local_10;
  QArrayDataPointer<char16_t> *local_8;
  
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   (QString *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  QString::QString((QString *)0x21bc3a);
  bVar2 = QString::isEmpty((QString *)(in_RDI + 0x20));
  if (!bVar2) {
    QString::operator=(&local_80,(QString *)(in_RDI + 0x20));
  }
  iVar1 = *(int *)(in_RDI + 0x18);
  if (iVar1 == 0) {
    bVar2 = std::optional::operator_cast_to_bool((optional<QFlags<QFileDialog::Option>_> *)0x21bccd)
    ;
    if (bVar2) {
      local_8 = local_108;
      local_10 = L";;";
      local_18 = L";;";
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_108,(Data *)0x0,L";;",2);
      QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
      ;
      QListSpecialMethods<QString>::join(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      pQVar4 = std::optional<QFlags<QFileDialog::Option>_>::operator*
                         ((optional<QFlags<QFileDialog::Option>_> *)0x21bd7e);
      in_stack_fffffffffffffd08 = pQVar4->i;
      local_10c = in_stack_fffffffffffffd08;
      QFileDialog::getOpenFileName
                (local_c0,(QString *)0x0,(QString *)(in_RDI + 0x38),&local_80,&local_d8,
                 (QFlags_conflict1 *)0x0);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         (QString *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      QString::~QString((QString *)0x21bde1);
      QString::~QString((QString *)0x21bdee);
      QString::~QString((QString *)0x21bdfb);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    }
    else {
      local_20 = local_170;
      local_28 = L";;";
      local_30 = L";;";
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_170,(Data *)0x0,L";;",2);
      QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
      ;
      QListSpecialMethods<QString>::join(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      QFlags<QFileDialog::Option>::QFlags(&local_174);
      QFileDialog::getOpenFileName
                (local_128,(QString *)0x0,(QString *)(in_RDI + 0x38),&local_80,&local_140,
                 (QFlags_conflict1 *)0x0);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         (QString *)CONCAT44(in_stack_fffffffffffffd0c,local_174.i));
      QString::~QString((QString *)0x21bf7a);
      QString::~QString((QString *)0x21bf87);
      QString::~QString((QString *)0x21bf94);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
      in_stack_fffffffffffffd08 = local_174.i;
    }
  }
  else if (iVar1 == 1) {
    bVar2 = std::optional::operator_cast_to_bool((optional<QFlags<QFileDialog::Option>_> *)0x21c025)
    ;
    if (bVar2) {
      local_38 = local_1d8;
      local_40 = L";;";
      local_48 = L";;";
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_1d8,(Data *)0x0,L";;",2);
      QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
      ;
      QListSpecialMethods<QString>::join(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      pQVar4 = std::optional<QFlags<QFileDialog::Option>_>::operator*
                         ((optional<QFlags<QFileDialog::Option>_> *)0x21c0d6);
      in_stack_fffffffffffffd08 = pQVar4->i;
      local_1dc = in_stack_fffffffffffffd08;
      QFileDialog::getSaveFileName
                (local_190,(QString *)0x0,(QString *)(in_RDI + 0x38),&local_80,&local_1a8,
                 (QFlags_conflict1 *)0x0);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         (QString *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      QString::~QString((QString *)0x21c139);
      QString::~QString((QString *)0x21c146);
      QString::~QString((QString *)0x21c153);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    }
    else {
      this_00 = (QListSpecialMethods<QString> *)(in_RDI + 0x38);
      local_50 = local_240;
      local_58 = L";;";
      local_60 = L";;";
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_240,(Data *)0x0,L";;",2);
      QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
      ;
      QListSpecialMethods<QString>::join(this_00,in_stack_fffffffffffffd20);
      QFlags<QFileDialog::Option>::QFlags(&local_244);
      QFileDialog::getSaveFileName
                (local_1f8,(QString *)0x0,(QString *)this_00,&local_80,&local_210,
                 (QFlags_conflict1 *)0x0);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         (QString *)CONCAT44(in_stack_fffffffffffffd0c,local_244.i));
      QString::~QString((QString *)0x21c2d2);
      QString::~QString((QString *)0x21c2df);
      QString::~QString((QString *)0x21c2ec);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
      in_stack_fffffffffffffd08 = local_244.i;
    }
  }
  else if (iVar1 == 2) {
    bVar2 = std::optional::operator_cast_to_bool((optional<QFlags<QFileDialog::Option>_> *)0x21c37d)
    ;
    if (bVar2) {
      pQVar3 = (QString *)(in_RDI + 0x38);
      pQVar4 = std::optional<QFlags<QFileDialog::Option>_>::operator*
                         ((optional<QFlags<QFileDialog::Option>_> *)0x21c39d);
      local_264 = pQVar4->i;
      QFileDialog::getExistingDirectory
                (local_260,(QString *)0x0,pQVar3,(QFlags_conflict1 *)&local_80);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         (QString *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      QString::~QString((QString *)0x21c3f0);
    }
    else {
      QFlags<QFileDialog::Option>::QFlags(&local_284,ShowDirsOnly);
      QFileDialog::getExistingDirectory
                (local_280,(QString *)0x0,(QString *)(in_RDI + 0x38),(QFlags_conflict1 *)&local_80);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         (QString *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      QString::~QString((QString *)0x21c44d);
    }
  }
  bVar2 = QString::isNull((QString *)0x21c45c);
  if (!bVar2) {
    QFileAction::setFilePath
              ((QFileAction *)CONCAT17(bVar2,in_stack_fffffffffffffd10),
               (QString *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  }
  QString::~QString((QString *)0x21c493);
  QString::~QString((QString *)0x21c4a0);
  return;
}

Assistant:

void triggered() {
        QString dir = directory;
        QString fn;

        if (!filePath.isEmpty()) {
            dir = filePath;
        }

        switch (type) {
        case QFileAction::Type::OpenFile:
            if (options) {
                fn = QFileDialog::getOpenFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")), nullptr,
                                                  *options);
            } else {
                fn = QFileDialog::getOpenFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")));
            }

            break;
        case QFileAction::Type::SaveFile:
            if (options) {
                fn = QFileDialog::getSaveFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")), nullptr,
                                                  *options);
            } else {
                fn = QFileDialog::getSaveFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")));
            }

            break;
        case QFileAction::Type::OpenFolder:
            if (options) {
                fn = QFileDialog::getExistingDirectory(nullptr, caption, dir, *options);
            } else {
                fn = QFileDialog::getExistingDirectory(nullptr, caption, dir);
            }

            break;
        }

        if (!fn.isNull()) {
            action->setFilePath(fn);
        }
    }